

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context.hpp
# Opt level: O3

PointerType * __thiscall
LLVMBC::LLVMContext::construct<LLVMBC::PointerType,LLVMBC::Type*&,unsigned_int&>
          (LLVMContext *this,Type **u,uint *u_1)

{
  uint uVar1;
  Type *pTVar2;
  PointerType *pPVar3;
  
  pPVar3 = (PointerType *)allocate(this,0x18,8);
  if (pPVar3 != (PointerType *)0x0) {
    pTVar2 = *u;
    uVar1 = *u_1;
    (pPVar3->super_Type).context = pTVar2->context;
    (pPVar3->super_Type).type_id = PointerTyID;
    pPVar3->contained_type = pTVar2;
    (pPVar3->super_Type).address_space = uVar1;
    return pPVar3;
  }
  std::terminate();
}

Assistant:

T *construct(U &&... u)
	{
		T *mem = static_cast<T *>(allocate(sizeof(T), alignof(T)));
		if (!mem)
			std::terminate();
		T *t = new (mem) T(std::forward<U>(u)...);

		if (!std::is_trivially_destructible<T>::value)
			append_typed_destructor(t);
		return t;
	}